

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall Assimp::XFileParser::ParseDataObjectSkinWeights(XFileParser *this,Mesh *pMesh)

{
  vector<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_> *this_00;
  pointer pBVar1;
  uint uVar2;
  uint uVar3;
  uint a;
  ulong uVar4;
  ulong __n;
  bool bVar5;
  ai_real aVar6;
  string transformNodeName;
  BoneWeight weight;
  string local_c8;
  Bone local_a8;
  
  if (pMesh != (Mesh *)0x0) {
    readHeadOfDataObject(this,(string *)0x0);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
    GetNextTokenAsString(this,&local_c8);
    local_a8.mName._M_dataplus._M_p = (pointer)&local_a8.mName.field_2;
    local_a8.mName.field_2._M_allocated_capacity = 0;
    local_a8.mName.field_2._8_8_ = 0;
    local_a8.mName._M_string_length = 0;
    local_a8.mWeights.
    super__Vector_base<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.mWeights.
    super__Vector_base<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.mWeights.
    super__Vector_base<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.mOffsetMatrix.a1 = 1.0;
    local_a8.mOffsetMatrix.a2 = 0.0;
    local_a8.mOffsetMatrix.a3 = 0.0;
    local_a8.mOffsetMatrix.a4 = 0.0;
    local_a8.mOffsetMatrix.b1 = 0.0;
    local_a8.mOffsetMatrix.b2 = 1.0;
    local_a8.mOffsetMatrix.b3 = 0.0;
    local_a8.mOffsetMatrix.b4 = 0.0;
    local_a8.mOffsetMatrix.c1 = 0.0;
    local_a8.mOffsetMatrix.c2 = 0.0;
    local_a8.mOffsetMatrix.c3 = 1.0;
    local_a8.mOffsetMatrix.c4 = 0.0;
    local_a8.mOffsetMatrix.d1 = 0.0;
    local_a8.mOffsetMatrix.d2 = 0.0;
    local_a8.mOffsetMatrix.d3 = 0.0;
    local_a8.mOffsetMatrix.d4 = 1.0;
    std::vector<Assimp::XFile::Bone,_std::allocator<Assimp::XFile::Bone>_>::
    emplace_back<Assimp::XFile::Bone>(&pMesh->mBones,&local_a8);
    XFile::Bone::~Bone(&local_a8);
    pBVar1 = (pMesh->mBones).
             super__Vector_base<Assimp::XFile::Bone,_std::allocator<Assimp::XFile::Bone>_>._M_impl.
             super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_assign((string *)(pBVar1 + -1));
    uVar2 = ReadInt(this);
    this_00 = &pBVar1[-1].mWeights;
    __n = (ulong)uVar2;
    std::vector<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_>::reserve
              (this_00,__n);
    while (bVar5 = uVar2 != 0, uVar2 = uVar2 - 1, bVar5) {
      uVar3 = ReadInt(this);
      local_a8.mName._M_dataplus._M_p._0_4_ = uVar3;
      std::vector<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_>::push_back
                (this_00,(value_type *)&local_a8);
    }
    for (uVar4 = 0; __n != uVar4; uVar4 = uVar4 + 1) {
      aVar6 = ReadFloat(this);
      (this_00->
      super__Vector_base<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_>).
      _M_impl.super__Vector_impl_data._M_start[uVar4].mWeight = aVar6;
    }
    aVar6 = ReadFloat(this);
    pBVar1[-1].mOffsetMatrix.a1 = aVar6;
    aVar6 = ReadFloat(this);
    pBVar1[-1].mOffsetMatrix.b1 = aVar6;
    aVar6 = ReadFloat(this);
    pBVar1[-1].mOffsetMatrix.c1 = aVar6;
    aVar6 = ReadFloat(this);
    pBVar1[-1].mOffsetMatrix.d1 = aVar6;
    aVar6 = ReadFloat(this);
    pBVar1[-1].mOffsetMatrix.a2 = aVar6;
    aVar6 = ReadFloat(this);
    pBVar1[-1].mOffsetMatrix.b2 = aVar6;
    aVar6 = ReadFloat(this);
    pBVar1[-1].mOffsetMatrix.c2 = aVar6;
    aVar6 = ReadFloat(this);
    pBVar1[-1].mOffsetMatrix.d2 = aVar6;
    aVar6 = ReadFloat(this);
    pBVar1[-1].mOffsetMatrix.a3 = aVar6;
    aVar6 = ReadFloat(this);
    pBVar1[-1].mOffsetMatrix.b3 = aVar6;
    aVar6 = ReadFloat(this);
    pBVar1[-1].mOffsetMatrix.c3 = aVar6;
    aVar6 = ReadFloat(this);
    pBVar1[-1].mOffsetMatrix.d3 = aVar6;
    aVar6 = ReadFloat(this);
    pBVar1[-1].mOffsetMatrix.a4 = aVar6;
    aVar6 = ReadFloat(this);
    pBVar1[-1].mOffsetMatrix.b4 = aVar6;
    aVar6 = ReadFloat(this);
    pBVar1[-1].mOffsetMatrix.c4 = aVar6;
    aVar6 = ReadFloat(this);
    pBVar1[-1].mOffsetMatrix.d4 = aVar6;
    CheckForSemicolon(this);
    CheckForClosingBrace(this);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return;
}

Assistant:

void XFileParser::ParseDataObjectSkinWeights( Mesh *pMesh) {
    if ( nullptr == pMesh ) {
        return;
    }
    readHeadOfDataObject();

    std::string transformNodeName;
    GetNextTokenAsString( transformNodeName);

    pMesh->mBones.push_back( Bone());
    Bone& bone = pMesh->mBones.back();
    bone.mName = transformNodeName;

    // read vertex weights
    unsigned int numWeights = ReadInt();
    bone.mWeights.reserve( numWeights);

    for( unsigned int a = 0; a < numWeights; a++)
    {
        BoneWeight weight;
        weight.mVertex = ReadInt();
        bone.mWeights.push_back( weight);
    }

    // read vertex weights
    for( unsigned int a = 0; a < numWeights; a++)
        bone.mWeights[a].mWeight = ReadFloat();

    // read matrix offset
    bone.mOffsetMatrix.a1 = ReadFloat(); bone.mOffsetMatrix.b1 = ReadFloat();
    bone.mOffsetMatrix.c1 = ReadFloat(); bone.mOffsetMatrix.d1 = ReadFloat();
    bone.mOffsetMatrix.a2 = ReadFloat(); bone.mOffsetMatrix.b2 = ReadFloat();
    bone.mOffsetMatrix.c2 = ReadFloat(); bone.mOffsetMatrix.d2 = ReadFloat();
    bone.mOffsetMatrix.a3 = ReadFloat(); bone.mOffsetMatrix.b3 = ReadFloat();
    bone.mOffsetMatrix.c3 = ReadFloat(); bone.mOffsetMatrix.d3 = ReadFloat();
    bone.mOffsetMatrix.a4 = ReadFloat(); bone.mOffsetMatrix.b4 = ReadFloat();
    bone.mOffsetMatrix.c4 = ReadFloat(); bone.mOffsetMatrix.d4 = ReadFloat();

    CheckForSemicolon();
    CheckForClosingBrace();
}